

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code
llvm::sys::fs::make_absolute
          (Twine *current_directory,SmallVectorImpl<char> *path,bool use_current_directory)

{
  StringRef path_00;
  bool bVar1;
  uint uVar2;
  error_category *peVar3;
  Style style;
  StringRef path_01;
  StringRef path_02;
  error_code eVar4;
  StringRef path_03;
  StringRef p;
  StringRef pRelativePath;
  StringRef bRelativePath;
  StringRef bRootDirectory;
  StringRef pRootName;
  SmallString<128U> current_dir;
  Twine local_120;
  Twine local_108;
  Twine local_f0;
  Twine local_d8;
  SmallString<128U> res;
  
  p.Data = (char *)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  p.Length = (size_t)(path->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  Twine::Twine((Twine *)&current_dir,&p);
  bVar1 = sys::path::has_root_directory((Twine *)&current_dir,native);
  if (bVar1) {
    uVar2 = 0;
    peVar3 = (error_category *)std::_V2::system_category();
    goto LAB_001205a6;
  }
  current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &current_dir.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
  style = windows;
  current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  if (use_current_directory) {
    Twine::toVector(current_directory,(SmallVectorImpl<char> *)&current_dir);
LAB_00120485:
    path_00.Length = p.Length;
    path_00.Data = p.Data;
    pRootName = sys::path::root_name(path_00,native);
    path_03.Length._0_4_ =
         current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.Size;
    path_03.Data = (char *)current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    path_03.Length._4_4_ = 0;
    bRootDirectory = sys::path::root_directory(path_03,native);
    path_01.Data = (char *)(ulong)current_dir.super_SmallVector<char,_128U>.
                                  super_SmallVectorImpl<char>.
                                  super_SmallVectorTemplateBase<char,_true>.
                                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                  Size;
    path_01.Length = 2;
    bRelativePath =
         sys::path::relative_path
                   ((path *)current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                    ,path_01,style);
    path_02.Length = 2;
    path_02.Data = (char *)p.Length;
    pRelativePath = sys::path::relative_path((path *)p.Data,path_02,style);
    res.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX =
         &res.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
    res.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    res.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x80;
    Twine::Twine(&local_d8,&pRootName);
    Twine::Twine(&local_f0,&bRootDirectory);
    Twine::Twine(&local_108,&bRelativePath);
    Twine::Twine(&local_120,&pRelativePath);
    sys::path::append((SmallVectorImpl<char> *)&res,&local_d8,&local_f0,&local_108,&local_120);
    SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)&res);
    peVar3 = (error_category *)std::_V2::system_category();
    SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&res);
    uVar2 = 0;
  }
  else {
    eVar4 = current_path((SmallVectorImpl<char> *)&current_dir);
    peVar3 = eVar4._M_cat;
    uVar2 = eVar4._M_value;
    if (uVar2 == 0) goto LAB_00120485;
  }
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&current_dir);
LAB_001205a6:
  eVar4._4_4_ = 0;
  eVar4._M_value = uVar2;
  eVar4._M_cat = peVar3;
  return eVar4;
}

Assistant:

static std::error_code make_absolute(const Twine &current_directory,
                                     SmallVectorImpl<char> &path,
                                     bool use_current_directory) {
  StringRef p(path.data(), path.size());

  bool rootDirectory = path::has_root_directory(p);
  bool rootName =
      (real_style(Style::native) != Style::windows) || path::has_root_name(p);

  // Already absolute.
  if (rootName && rootDirectory)
    return std::error_code();

  // All of the following conditions will need the current directory.
  SmallString<128> current_dir;
  if (use_current_directory)
    current_directory.toVector(current_dir);
  else if (std::error_code ec = current_path(current_dir))
    return ec;

  // Relative path. Prepend the current directory.
  if (!rootName && !rootDirectory) {
    // Append path to the current directory.
    path::append(current_dir, p);
    // Set path to the result.
    path.swap(current_dir);
    return std::error_code();
  }

  if (!rootName && rootDirectory) {
    StringRef cdrn = path::root_name(current_dir);
    SmallString<128> curDirRootName(cdrn.begin(), cdrn.end());
    path::append(curDirRootName, p);
    // Set path to the result.
    path.swap(curDirRootName);
    return std::error_code();
  }

  if (rootName && !rootDirectory) {
    StringRef pRootName      = path::root_name(p);
    StringRef bRootDirectory = path::root_directory(current_dir);
    StringRef bRelativePath  = path::relative_path(current_dir);
    StringRef pRelativePath  = path::relative_path(p);

    SmallString<128> res;
    path::append(res, pRootName, bRootDirectory, bRelativePath, pRelativePath);
    path.swap(res);
    return std::error_code();
  }

  llvm_unreachable("All rootName and rootDirectory combinations should have "
                   "occurred above!");
}